

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastexp_test.cpp
# Opt level: O2

void __thiscall FASTEXP_BigExp_Test::TestBody(FASTEXP_BigExp_Test *this)

{
  ll lhs;
  char *message;
  internal local_30 [8];
  AssertionResult gtest_ar;
  AssertHelper local_18;
  
  lhs = fastexp(0x97dbca6,0x2360c78abea6594,0x1f8dc715);
  testing::internal::CmpHelperEQ
            (local_30,"fastexp(159235238, 159328549238105492LL, 529385237)","481182887LL",lhs,
             0x1cae44a7);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&gtest_ar.message_);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/number-theory/fastexp_test.cpp"
               ,0x17,message);
    testing::internal::AssertHelper::operator=(&local_18,(Message *)&gtest_ar.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_18);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar.message_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar);
  return;
}

Assistant:

TEST(FASTEXP, BigExp) {
	EXPECT_EQ(fastexp(159235238, 159328549238105492LL, 529385237), 481182887LL);
}